

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

_Bool array_container_is_subset_run(array_container_t *container1,run_container_t *container2)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  int *in_RSI;
  int *in_RDI;
  uint32_t stop;
  uint32_t start;
  int i_run;
  int i_array;
  run_container_t *in_stack_ffffffffffffffc8;
  int local_20;
  int local_1c;
  
  iVar1 = *in_RDI;
  iVar3 = run_container_cardinality(in_stack_ffffffffffffffc8);
  if (iVar1 <= iVar3) {
    local_1c = 0;
    local_20 = 0;
    while( true ) {
      bVar2 = false;
      if (local_1c < *in_RDI) {
        bVar2 = local_20 < *in_RSI;
      }
      if (!bVar2) {
        if (local_1c != *in_RDI) {
          return false;
        }
        return true;
      }
      uVar4 = (uint)*(ushort *)(*(long *)(in_RSI + 2) + (long)local_20 * 4);
      if (*(ushort *)(*(long *)(in_RDI + 2) + (long)local_1c * 2) < uVar4) break;
      if (uVar4 + *(ushort *)(*(long *)(in_RSI + 2) + 2 + (long)local_20 * 4) <
          (uint)*(ushort *)(*(long *)(in_RDI + 2) + (long)local_1c * 2)) {
        local_20 = local_20 + 1;
      }
      else {
        local_1c = local_1c + 1;
      }
    }
  }
  return false;
}

Assistant:

bool array_container_is_subset_run(const array_container_t* container1,
                                   const run_container_t* container2) {
    if (container1->cardinality > run_container_cardinality(container2))
        return false;
    int i_array = 0, i_run = 0;
    while (i_array < container1->cardinality && i_run < container2->n_runs) {
        uint32_t start = container2->runs[i_run].value;
        uint32_t stop = start + container2->runs[i_run].length;
        if (container1->array[i_array] < start) {
            return false;
        } else if (container1->array[i_array] > stop) {
            i_run++;
        } else {  // the value of the array is in the run
            i_array++;
        }
    }
    if (i_array == container1->cardinality) {
        return true;
    } else {
        return false;
    }
}